

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O0

Var Js::HelperMethodWrapper<Js::HelperMethodWrapper1(Js::ScriptContext*,void*,void*)::__0>
              (ScriptContext *scriptContext,anon_class_16_2_a2bd5e14 fn)

{
  bool bVar1;
  ThreadContext *pTVar2;
  Var in_RCX;
  anon_class_16_2_a2bd5e14 fn_00;
  AutoRegisterIgnoreExceptionWrapper local_30;
  AutoRegisterIgnoreExceptionWrapper autoWrapper;
  ScriptContext *scriptContext_local;
  anon_class_16_2_a2bd5e14 fn_local;
  
  fn_local.origHelperAddr = fn.arg1;
  scriptContext_local = (ScriptContext *)fn.origHelperAddr;
  autoWrapper.m_threadContext = (ThreadContext *)scriptContext;
  pTVar2 = ScriptContext::GetThreadContext(scriptContext);
  bVar1 = AutoRegisterIgnoreExceptionWrapper::IsRegistered(pTVar2);
  if (bVar1) {
    fn_local.arg1 =
         HelperMethodWrapper1::anon_class_16_2_a2bd5e14::operator()
                   ((anon_class_16_2_a2bd5e14 *)&scriptContext_local);
  }
  else {
    pTVar2 = ScriptContext::GetThreadContext(autoWrapper.m_threadContext);
    AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper(&local_30,pTVar2);
    fn_00.arg1 = in_RCX;
    fn_00.origHelperAddr = fn_local.origHelperAddr;
    fn_local.arg1 =
         HelperOrLibraryMethodWrapper<false,Js::HelperMethodWrapper1(Js::ScriptContext*,void*,void*)::__0>
                   ((Js *)autoWrapper.m_threadContext,scriptContext_local,fn_00);
    AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_30);
  }
  return fn_local.arg1;
}

Assistant:

Var HelperMethodWrapper(ScriptContext* scriptContext, Fn fn)
    {
        if (AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->GetThreadContext()))
        {
            return fn();
        }
        else
        {
            AutoRegisterIgnoreExceptionWrapper autoWrapper(scriptContext->GetThreadContext());
            return HelperOrLibraryMethodWrapper<false>(scriptContext, fn);
        }
    }